

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstantExecution.h
# Opt level: O2

void nrg::InstantExecution::push<void(*)(int,std::__cxx11::string_const&),int&,char_const(&)[7]>
               (Queue *queue,
               _func_void_int_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
               *fn,int *param,char (*param_4) [7])

{
  QueueElement elem;
  function<void_()> fStack_68;
  function<void_()> local_48;
  anon_class_24_3_7e084ec6 local_28;
  
  local_28.param = *param;
  local_28._12_3_ = SUB43(*(undefined4 *)*param_4,0);
  local_28._15_1_ = SUB41(*(undefined4 *)(*param_4 + 3),0);
  local_28._16_3_ = SUB43((uint)*(undefined4 *)(*param_4 + 3) >> 8,0);
  local_28.fn = fn;
  std::function<void()>::
  function<nrg::InstantExecution::push<void(*)(int,std::__cxx11::string_const&),int&,char_const(&)[7]>(std::queue<std::function<void()>,std::deque<std::function<void()>,std::allocator<std::function<void()>>>>&,void(*)(int,std::__cxx11::string_const&),int&,char_const(&)[7])::_lambda()_1_,void>
            ((function<void()> *)&local_48,&local_28);
  std::function<void_()>::function(&fStack_68,&local_48);
  std::deque<std::function<void()>,std::allocator<std::function<void()>>>::
  emplace_back<std::function<void()>>
            ((deque<std::function<void()>,std::allocator<std::function<void()>>> *)queue,&fStack_68)
  ;
  std::_Function_base::~_Function_base(&fStack_68.super__Function_base);
  std::_Function_base::~_Function_base(&local_48.super__Function_base);
  return;
}

Assistant:

static void push(Queue& queue, FN fn, Param&&... param)
    {
        QueueElement elem = [=]() { fn(param...); };
        push(queue, elem);
    }